

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FieldGenerator::SetInlinedStringIndex
          (FieldGenerator *this,int32_t inlined_string_index)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  LogMessage *other;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  int iVar5;
  AlphaNum *this_01;
  Hex hex;
  Hex hex_00;
  AlphaNum *in_stack_fffffffffffffe88;
  AlphaNum local_168;
  AlphaNum local_138;
  key_type local_108;
  string local_e8;
  char *local_c8;
  char *local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar2 = IsStringInlined(this->descriptor_,this->options_);
  if (bVar2) {
    local_c8 = "(_inlined_string_donated_[";
    iVar5 = inlined_string_index + 0x1f;
    if (-1 < inlined_string_index) {
      iVar5 = inlined_string_index;
    }
    local_c0 = (char *)0x1a;
    pcVar1 = local_90.digits;
    local_90.piece_data_ = pcVar1;
    pcVar3 = FastInt32ToBufferLeft(iVar5 >> 5,pcVar1);
    local_90.piece_size_ = (long)pcVar3 - (long)pcVar1;
    local_60.piece_data_ = "] & 0x";
    local_60.piece_size_ = 6;
    hex.value = (ulong)(uint)(1 << ((byte)inlined_string_index & 0x1f));
    this_01 = &local_138;
    hex._8_8_ = 8;
    strings::AlphaNum::AlphaNum(this_01,hex);
    local_168.piece_data_ = "u) != 0;";
    local_168.piece_size_ = 8;
    StrCat_abi_cxx11_(&local_e8,(protobuf *)&local_c8,&local_90,&local_60,this_01,&local_168,
                      in_stack_fffffffffffffe88);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"inlined_string_donated","");
    this_00 = &this->variables_;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_108);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    local_c8 = "_inlined_string_donated_[";
    local_c0 = (char *)0x19;
    local_90.piece_data_ = pcVar1;
    pcVar3 = FastInt32ToBufferLeft(iVar5 >> 5,pcVar1);
    local_90.piece_size_ = (long)pcVar3 - (long)pcVar1;
    local_60.piece_data_ = "]";
    local_60.piece_size_ = 1;
    StrCat_abi_cxx11_((string *)&local_138,(protobuf *)&local_c8,&local_90,&local_60,this_01);
    pcVar1 = local_168.digits;
    local_168.piece_data_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"donating_states_word","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)&local_168);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_138);
    if (local_168.piece_data_ != pcVar1) {
      operator_delete(local_168.piece_data_);
    }
    if (local_138.piece_data_ != local_138.digits) {
      operator_delete(local_138.piece_data_);
    }
    local_c8 = "~0x";
    local_c0 = (char *)0x3;
    hex_00._8_8_ = 8;
    hex_00.value = hex.value;
    strings::AlphaNum::AlphaNum(&local_90,hex_00);
    local_60.piece_data_ = "u";
    local_60.piece_size_ = 1;
    StrCat_abi_cxx11_((string *)&local_138,(protobuf *)&local_c8,&local_90,&local_60,this_01);
    local_168.piece_data_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"mask_for_undonate","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)&local_168);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_138);
    if (local_168.piece_data_ != pcVar1) {
      operator_delete(local_168.piece_data_);
    }
    if (local_138.piece_data_ != local_138.digits) {
      operator_delete(local_138.piece_data_);
    }
  }
  else if (inlined_string_index != -1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_field.cc"
               ,0x11f);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&local_c8,"CHECK failed: (inlined_string_index) == (-1): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,other);
    internal::LogMessage::~LogMessage((LogMessage *)&local_c8);
  }
  return;
}

Assistant:

void FieldGenerator::SetInlinedStringIndex(int32_t inlined_string_index) {
  if (!IsStringInlined(descriptor_, options_)) {
    GOOGLE_CHECK_EQ(inlined_string_index, -1);
    return;
  }
  variables_["inlined_string_donated"] = StrCat(
      "(_inlined_string_donated_[", inlined_string_index / 32, "] & 0x",
      strings::Hex(1u << (inlined_string_index % 32), strings::ZERO_PAD_8),
      "u) != 0;");
  variables_["donating_states_word"] =
      StrCat("_inlined_string_donated_[", inlined_string_index / 32, "]");
  variables_["mask_for_undonate"] = StrCat(
      "~0x", strings::Hex(1u << (inlined_string_index % 32), strings::ZERO_PAD_8),
      "u");
}